

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLiNois.cpp
# Opt level: O1

void __thiscall NaLinearNoiseGen::NaLinearNoiseGen(NaLinearNoiseGen *this,uint nChainLen)

{
  NaLinearUnitsChain *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  NaUnit::NaUnit(&this->super_NaUnit,1,1,0);
  NaConfigPart::NaConfigPart(&this->super_NaConfigPart,"LinearNoiseGenerator");
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_001741d8;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaLinearNoiseGen_00174258;
  NaRandomSequence::NaRandomSequence(&this->RandSeq);
  this_00 = &this->LinChain;
  NaLinearUnitsChain::NaLinearUnitsChain(this_00,nChainLen);
  iVar1 = (*(this_00->super_NaDynAr<NaLinearUnit>)._vptr_NaDynAr[0xf])(this_00,0);
  *(undefined1 *)(CONCAT44(extraout_var,iVar1) + 0x40) = 1;
  NaConfigPart::SetInstance(&(this->RandSeq).super_NaConfigPart,"InLinearNoiseGenerator");
  NaConfigPart::SetInstance(&(this->LinChain).super_NaConfigPart,"InLinearNoiseGenerator");
  return;
}

Assistant:

NaLinearNoiseGen::NaLinearNoiseGen (unsigned nChainLen)
:   LinChain(nChainLen), NaConfigPart("LinearNoiseGenerator")
{
    // Linear chain initialization
    LinChain[0].act = true;
    RandSeq.SetInstance("InLinearNoiseGenerator");
    LinChain.SetInstance("InLinearNoiseGenerator");
}